

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(void)

{
  ImGuiViewportP *this;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiViewportP **in_stack_ffffffffffffff68;
  ImGuiSettingsHandler *handler;
  undefined8 uVar1;
  int new_size;
  ImGuiSettingsHandler local_50;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  handler = &local_50;
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)0x497745);
  local_50.TypeName = "Window";
  local_50.TypeHash = ImHashStr("Window",0,0);
  local_50.ClearAllFn = WindowSettingsHandler_ClearAll;
  local_50.ReadOpenFn = WindowSettingsHandler_ReadOpen;
  local_50.ReadLineFn = WindowSettingsHandler_ReadLine;
  local_50.ApplyAllFn = WindowSettingsHandler_ApplyAll;
  local_50.WriteAllFn = WindowSettingsHandler_WriteAll;
  AddSettingsHandler(handler);
  TableSettingsAddSettingsHandler();
  LocalizeRegisterEntries(GLocalizationEntriesEnUS,7);
  uVar1 = 0xb8;
  this = (ImGuiViewportP *)MemAlloc((size_t)handler);
  ::operator_new(uVar1);
  new_size = (int)((ulong)uVar1 >> 0x20);
  ImGuiViewportP::ImGuiViewportP(this);
  ImVector<ImGuiViewportP_*>::push_back
            ((ImVector<ImGuiViewportP_*> *)handler,in_stack_ffffffffffffff68);
  ImVector<char>::resize((ImVector<char> *)this,new_size,(char *)handler);
  local_8->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow and ImGuiTable types
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }
    TableSettingsAddSettingsHandler();

    // Setup default localization table
    LocalizeRegisterEntries(GLocalizationEntriesEnUS, IM_ARRAYSIZE(GLocalizationEntriesEnUS));

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);
    g.TempBuffer.resize(1024 * 3 + 1, 0);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}